

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

void re2::FactorAlternationImpl::Round3
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  Regexp *pRVar1;
  ulong uVar2;
  CharClass *pCVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Rune *pRVar8;
  CharClassBuilder ccb;
  Regexp *re;
  int local_244;
  ulong local_240;
  ulong local_238;
  vector<re2::Splice,std::allocator<re2::Splice>> *local_230;
  Regexp *local_228;
  ulong local_220;
  ulong local_218;
  string local_210;
  CharClassBuilder local_1f0;
  LogMessage local_1b0;
  
  if (-1 < nsub) {
    uVar2 = (ulong)(uint)nsub;
    uVar7 = (ulong)(nsub + 1);
    uVar6 = 0;
    uVar5 = 0;
    local_228 = (Regexp *)0x0;
    local_240 = uVar2;
    local_238 = uVar7;
    local_230 = (vector<re2::Splice,std::allocator<re2::Splice>> *)splices;
    do {
      pRVar1 = local_228;
      if ((((uVar2 <= uVar6) || (pRVar1 = sub[uVar6], local_228 == (Regexp *)0x0)) ||
          ((local_228->op_ != '\x14' && (local_228->op_ != '\x03')))) ||
         ((pRVar1->op_ != '\x03' && (pRVar1->op_ != '\x14')))) {
        local_228 = pRVar1;
        if (uVar6 != (int)uVar5 + 1 && uVar6 != uVar5) {
          CharClassBuilder::CharClassBuilder(&local_1f0);
          uVar2 = (ulong)(int)uVar5;
          local_220 = uVar2;
          local_218 = uVar5;
          if ((long)uVar2 < (long)uVar6) {
            do {
              pRVar1 = sub[uVar2];
              if (pRVar1->op_ == '\x03') {
                CharClassBuilder::AddRangeFlags
                          (&local_1f0,(pRVar1->field_7).rune_,(pRVar1->field_7).rune_,
                           (uint)pRVar1->parse_flags_);
              }
              else {
                if (pRVar1->op_ != '\x14') {
                  LogMessage::LogMessage
                            (&local_1b0,
                             "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/parse.cc"
                             ,0x4a1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&local_1b0.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                             "RE2: unexpected op: ",0x14);
                  poVar4 = (ostream *)std::ostream::operator<<(&local_1b0.str_,(uint)pRVar1->op_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                  Regexp::ToString_abi_cxx11_(&local_210,pRVar1);
                  std::operator<<(poVar4,(string *)&local_210);
                  std::__cxx11::string::~string((string *)&local_210);
                  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
                }
                pCVar3 = (pRVar1->field_7).field_3.cc_;
                if (*(int *)(pCVar3 + 0x10) != 0) {
                  pRVar8 = *(Rune **)(pCVar3 + 8);
                  do {
                    CharClassBuilder::AddRange(&local_1f0,*pRVar8,pRVar8[1]);
                    pRVar8 = pRVar8 + 2;
                  } while (pRVar8 != (Rune *)((long)*(int *)(pCVar3 + 0x10) * 8 +
                                             *(long *)(pCVar3 + 8)));
                }
              }
              Regexp::Decref(pRVar1);
              uVar2 = uVar2 + 1;
            } while ((uVar2 & 0xffffffff) != uVar6);
          }
          pCVar3 = CharClassBuilder::GetCharClass(&local_1f0);
          local_1b0._0_8_ = Regexp::NewCharClass(pCVar3,flags);
          uVar5 = local_218;
          local_210._M_dataplus._M_p = (pointer)(sub + local_220);
          local_244 = (int)uVar6 - (int)local_218;
          std::vector<re2::Splice,std::allocator<re2::Splice>>::
          emplace_back<re2::Regexp*&,re2::Regexp**,int>
                    (local_230,(Regexp **)&local_1b0,(Regexp ***)&local_210,&local_244);
          std::
          _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
          ::~_Rb_tree(&local_1f0.ranges_._M_t);
          uVar2 = local_240;
          uVar7 = local_238;
        }
        uVar5 = uVar5 & 0xffffffff;
        if (uVar6 < uVar2) {
          uVar5 = uVar6 & 0xffffffff;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar7);
  }
  return;
}

Assistant:

void FactorAlternationImpl::Round3(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 3: Merge runs of literals and/or character classes.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // are either literals (i.e. runes) or character classes.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = sub[i];
      if (first != NULL &&
          (first->op() == kRegexpLiteral ||
           first->op() == kRegexpCharClass) &&
          (first_i->op() == kRegexpLiteral ||
           first_i->op() == kRegexpCharClass))
        continue;
    }

    // Found end of a run of Literal/CharClass:
    // sub[start:i] all are either one or the other,
    // but sub[i] is not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      CharClassBuilder ccb;
      for (int j = start; j < i; j++) {
        Regexp* re = sub[j];
        if (re->op() == kRegexpCharClass) {
          CharClass* cc = re->cc();
          for (CharClass::iterator it = cc->begin(); it != cc->end(); ++it)
            ccb.AddRange(it->lo, it->hi);
        } else if (re->op() == kRegexpLiteral) {
          ccb.AddRangeFlags(re->rune(), re->rune(), re->parse_flags());
        } else {
          LOG(DFATAL) << "RE2: unexpected op: " << re->op() << " "
                      << re->ToString();
        }
        re->Decref();
      }
      Regexp* re = Regexp::NewCharClass(ccb.GetCharClass(), flags);
      splices->emplace_back(re, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}